

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_concat(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 extraout_RAX;
  undefined1 *puVar10;
  undefined8 uVar11;
  undefined1 *puVar12;
  uint32_t uVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  undefined1 *puVar17;
  bson_t *pbVar18;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar19;
  bson_t expected;
  bson_t bcon;
  bson_t child;
  bson_t child2;
  undefined8 uStack_7050;
  uint8_t *puStack_7048;
  undefined1 *puStack_7040;
  undefined1 auStack_7030 [8];
  void *pvStack_7028;
  undefined8 uStack_7018;
  undefined8 uStack_7010;
  char *pcStack_7008;
  undefined8 uStack_6ff0;
  undefined1 auStack_6f80 [25944];
  void *pvStack_a28;
  char *pcStack_a20;
  char *pcStack_a18;
  char *pcStack_a10;
  code *pcStack_a08;
  bson_t bStack_a00;
  undefined1 auStack_980 [4];
  uint uStack_97c;
  undefined1 auStack_900 [336];
  void *pvStack_7b0;
  ulong uStack_7a8;
  undefined1 *puStack_7a0;
  ulong uStack_798;
  void *pvStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  void *pvStack_630;
  undefined1 *puStack_628;
  undefined1 *puStack_620;
  void *pvStack_618;
  ulong uStack_610;
  code *pcStack_608;
  undefined1 auStack_600 [4];
  uint uStack_5fc;
  undefined1 auStack_580 [4];
  uint uStack_57c;
  undefined1 auStack_500 [336];
  void *pvStack_3b0;
  undefined1 *puStack_3a8;
  undefined1 *puStack_3a0;
  char *pcStack_398;
  char *pcStack_390;
  code *apcStack_388 [16];
  undefined8 local_308;
  undefined1 local_300 [4];
  uint local_2fc;
  undefined1 local_280 [4];
  uint local_27c;
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  apcStack_388[0] = (code *)0x13b822;
  bson_init(local_280);
  apcStack_388[0] = (code *)0x13b832;
  bson_init(local_300);
  apcStack_388[0] = (code *)0x13b842;
  bson_init(local_200);
  apcStack_388[0] = (code *)0x13b852;
  bson_init(local_180);
  apcStack_388[0] = (code *)0x13b873;
  bson_append_utf8(local_200,"hello",0xffffffff,"world",0xffffffff);
  apcStack_388[0] = (code *)0x13b88d;
  bson_append_document(local_300,"foo",0xffffffff,local_200);
  apcStack_388[0] = (code *)0x13b892;
  local_308 = bson_bcon_magic();
  apcStack_388[0] = (code *)0x0;
  pcStack_390 = "}";
  pcStack_398 = (char *)0x13b8c2;
  bcon_append(local_280,"foo","{",local_308,0x15,local_200);
  apcStack_388[0] = (code *)0x13b8ce;
  pvVar4 = (void *)bson_get_data(local_280);
  apcStack_388[0] = (code *)0x13b8d9;
  pvVar5 = (void *)bson_get_data(local_300);
  if (local_2fc == local_27c) {
    apcStack_388[0] = (code *)0x13b8fa;
    pvVar6 = (void *)bson_get_data(local_300);
    apcStack_388[0] = (code *)0x13b90a;
    pvVar7 = (void *)bson_get_data(local_280);
    apcStack_388[0] = (code *)0x13b919;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)local_2fc);
    if (iVar1 != 0) goto LAB_0013babb;
    apcStack_388[0] = (code *)0x13b92e;
    bson_reinit(local_280);
    apcStack_388[0] = (code *)0x13b93b;
    bson_reinit(local_300);
    apcStack_388[0] = (code *)0x13b94b;
    bson_reinit(local_200);
    apcStack_388[0] = (code *)0x13b96f;
    bson_append_utf8(local_200,"0",0xffffffff,"bar",0xffffffff);
    apcStack_388[0] = (code *)0x13b993;
    bson_append_utf8(local_200,"1",0xffffffff,"baz",0xffffffff);
    apcStack_388[0] = (code *)0x13b9b2;
    bson_append_array(local_300,"foo",0xffffffff,local_200);
    apcStack_388[0] = (code *)0x13b9cb;
    bson_append_utf8(local_180,"0",0xffffffff,"baz",0xffffffff);
    pcStack_390 = (char *)0x0;
    pcStack_398 = "]";
    puStack_3a8 = (undefined1 *)0x13ba0d;
    puStack_3a0 = local_180;
    bcon_append(local_280,"foo","[","bar",local_308,0x15);
    apcStack_388[0] = (code *)0x13ba1c;
    pvVar4 = (void *)bson_get_data(local_280);
    apcStack_388[0] = (code *)0x13ba2f;
    pvVar5 = (void *)bson_get_data(local_300);
    if (local_2fc == local_27c) {
      apcStack_388[0] = (code *)0x13ba51;
      pvVar6 = (void *)bson_get_data(local_300);
      apcStack_388[0] = (code *)0x13ba61;
      pvVar7 = (void *)bson_get_data(local_280);
      apcStack_388[0] = (code *)0x13ba70;
      iVar1 = bcmp(pvVar6,pvVar7,(ulong)local_2fc);
      if (iVar1 == 0) {
        apcStack_388[0] = (code *)0x13ba85;
        bson_destroy(local_280);
        apcStack_388[0] = (code *)0x13ba92;
        bson_destroy(local_200);
        apcStack_388[0] = (code *)0x13ba9f;
        bson_destroy(local_180);
        apcStack_388[0] = (code *)0x13baac;
        bson_destroy(local_300);
        return;
      }
    }
    puVar17 = local_280;
    apcStack_388[0] = (code *)0x13bb2d;
    uVar8 = bson_as_canonical_extended_json(puVar17,0);
    puVar12 = local_300;
    apcStack_388[0] = (code *)0x13bb42;
    uVar9 = bson_as_canonical_extended_json(puVar12,0);
    uVar2 = local_2fc;
    if (local_27c < local_2fc) {
      uVar2 = local_27c;
    }
    if (uVar2 != 0) {
      uVar2 = local_2fc;
      if (local_27c <= local_2fc) {
        uVar2 = local_27c;
      }
      uVar14 = 0;
      do {
        if (*(char *)((long)pvVar4 + uVar14) != *(char *)((long)pvVar5 + uVar14)) goto LAB_0013bc34;
        uVar14 = uVar14 + 1;
      } while (uVar2 != (uint)uVar14);
    }
    uVar2 = local_27c;
    if (local_27c < local_2fc) {
      uVar2 = local_2fc;
    }
    uVar14 = (ulong)(uVar2 - 1);
LAB_0013bc36:
    apcStack_388[0] = (code *)0x13bc54;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uVar8,uVar9);
    apcStack_388[0] = (code *)0x13bc6c;
    uVar2 = open("failure.bad.bson",0x42,0x1a0);
    uVar8 = (ulong)uVar2;
    apcStack_388[0] = (code *)0x13bc87;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar2 == 0xffffffff) goto LAB_0013bcea;
    puVar17 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013bcef;
    puVar12 = (undefined1 *)(ulong)local_27c;
    apcStack_388[0] = (code *)0x13bcab;
    puVar10 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar12);
    if (puVar10 != puVar12) goto LAB_0013bcf4;
    pvVar4 = (void *)(ulong)local_2fc;
    apcStack_388[0] = (code *)0x13bcc6;
    pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
    if (pvVar6 == pvVar4) {
      apcStack_388[0] = (code *)0x13bcd6;
      test_concat_cold_8();
      goto LAB_0013bcd6;
    }
  }
  else {
LAB_0013babb:
    puVar17 = local_280;
    apcStack_388[0] = (code *)0x13bacd;
    uVar9 = bson_as_canonical_extended_json(puVar17,0);
    puVar12 = local_300;
    apcStack_388[0] = (code *)0x13bae2;
    uVar11 = bson_as_canonical_extended_json(puVar12,0);
    uVar2 = local_2fc;
    if (local_27c < local_2fc) {
      uVar2 = local_27c;
    }
    if (uVar2 != 0) {
      uVar2 = local_2fc;
      if (local_27c <= local_2fc) {
        uVar2 = local_27c;
      }
      uVar8 = 0;
      do {
        if (*(char *)((long)pvVar4 + uVar8) != *(char *)((long)pvVar5 + uVar8)) {
          uVar8 = uVar8 & 0xffffffff;
          goto LAB_0013bb84;
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != (uint)uVar8);
    }
    uVar2 = local_27c;
    if (local_27c < local_2fc) {
      uVar2 = local_2fc;
    }
    uVar8 = (ulong)(uVar2 - 1);
LAB_0013bb84:
    apcStack_388[0] = (code *)0x13bba2;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8,uVar9,uVar11);
    apcStack_388[0] = (code *)0x13bbba;
    uVar2 = open("failure.bad.bson",0x42,0x1a0);
    uVar8 = (ulong)uVar2;
    apcStack_388[0] = (code *)0x13bbd5;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar2 == 0xffffffff) {
LAB_0013bcd6:
      apcStack_388[0] = (code *)0x13bcdb;
      test_concat_cold_5();
LAB_0013bcdb:
      apcStack_388[0] = (code *)0x13bce0;
      test_concat_cold_4();
LAB_0013bce0:
      apcStack_388[0] = (code *)0x13bce5;
      test_concat_cold_1();
    }
    else {
      puVar17 = (undefined1 *)(ulong)uVar3;
      if (uVar3 == 0xffffffff) goto LAB_0013bcdb;
      puVar12 = (undefined1 *)(ulong)local_27c;
      apcStack_388[0] = (code *)0x13bc01;
      puVar10 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar12);
      if (puVar10 != puVar12) goto LAB_0013bce0;
      pvVar4 = (void *)(ulong)local_2fc;
      apcStack_388[0] = (code *)0x13bc20;
      pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
      if (pvVar6 == pvVar4) {
        apcStack_388[0] = (code *)0x13bc34;
        uVar14 = uVar8;
        test_concat_cold_3();
        uVar9 = extraout_RAX;
LAB_0013bc34:
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0013bc36;
      }
    }
    apcStack_388[0] = (code *)0x13bcea;
    test_concat_cold_2();
LAB_0013bcea:
    apcStack_388[0] = (code *)0x13bcef;
    test_concat_cold_10();
LAB_0013bcef:
    apcStack_388[0] = (code *)0x13bcf4;
    test_concat_cold_9();
LAB_0013bcf4:
    apcStack_388[0] = (code *)0x13bcf9;
    test_concat_cold_6();
  }
  apcStack_388[0] = test_iter;
  test_concat_cold_7();
  puVar10 = auStack_600;
  pcStack_608 = (code *)0x13bd26;
  pvStack_3b0 = pvVar5;
  puStack_3a8 = puVar17;
  puStack_3a0 = puVar12;
  pcStack_398 = (char *)pvVar4;
  pcStack_390 = (char *)uVar8;
  apcStack_388[0] = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_580);
  pcStack_608 = (code *)0x13bd31;
  bson_init(auStack_600);
  pcStack_608 = (code *)0x13bd4d;
  bson_append_int32(auStack_600,"foo",0xffffffff,100);
  pcStack_608 = (code *)0x13bd63;
  bson_iter_init_find(auStack_500,auStack_600,"foo");
  pcStack_608 = (code *)0x13bd68;
  uVar9 = bson_bcon_magic();
  pcStack_608 = (code *)0x13bd83;
  bcon_append(auStack_580,"foo",uVar9,0x1d,auStack_500,0);
  pcStack_608 = (code *)0x13bd8b;
  pvVar4 = (void *)bson_get_data(auStack_580);
  pcStack_608 = (code *)0x13bd96;
  pvVar5 = (void *)bson_get_data(auStack_600);
  if (uStack_5fc == uStack_57c) {
    pcStack_608 = (code *)0x13bdaf;
    pvVar6 = (void *)bson_get_data(auStack_600);
    pcStack_608 = (code *)0x13bdbf;
    pvVar7 = (void *)bson_get_data(auStack_580);
    pcStack_608 = (code *)0x13bdce;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_5fc);
    if (iVar1 == 0) {
      pcStack_608 = (code *)0x13bddf;
      bson_destroy(auStack_580);
      pcStack_608 = (code *)0x13bde7;
      bson_destroy(auStack_600);
      return;
    }
  }
  puVar17 = auStack_580;
  pcStack_608 = (code *)0x13be08;
  uVar9 = bson_as_canonical_extended_json(puVar17,0);
  pcStack_608 = (code *)0x13be18;
  uVar11 = bson_as_canonical_extended_json(auStack_600,0);
  uVar2 = uStack_5fc;
  if (uStack_57c < uStack_5fc) {
    uVar2 = uStack_57c;
  }
  if (uVar2 != 0) {
    uVar2 = uStack_5fc;
    if (uStack_57c <= uStack_5fc) {
      uVar2 = uStack_57c;
    }
    uVar8 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar8) != *(char *)((long)pvVar5 + uVar8)) {
        uVar8 = uVar8 & 0xffffffff;
        goto LAB_0013be53;
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != (uint)uVar8);
  }
  uVar2 = uStack_57c;
  if (uStack_57c < uStack_5fc) {
    uVar2 = uStack_5fc;
  }
  uVar8 = (ulong)(uVar2 - 1);
LAB_0013be53:
  pcStack_608 = (code *)0x13be71;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8,uVar9,uVar11);
  pcStack_608 = (code *)0x13be89;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_608 = (code *)0x13bea4;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013bef0:
    pcStack_608 = (code *)0x13bef5;
    test_iter_cold_5();
LAB_0013bef5:
    pcStack_608 = (code *)0x13befa;
    test_iter_cold_4();
LAB_0013befa:
    pcStack_608 = (code *)0x13beff;
    test_iter_cold_1();
  }
  else {
    puVar17 = (undefined1 *)(ulong)uVar3;
    puVar10 = auStack_600;
    if (uVar3 == 0xffffffff) goto LAB_0013bef5;
    puVar10 = (undefined1 *)(ulong)uStack_57c;
    pcStack_608 = (code *)0x13bec8;
    puVar12 = (undefined1 *)write(uVar2,pvVar4,(size_t)puVar10);
    if (puVar12 != puVar10) goto LAB_0013befa;
    pvVar4 = (void *)(ulong)uStack_5fc;
    pcStack_608 = (code *)0x13bee0;
    pvVar6 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
    if (pvVar6 == pvVar4) {
      pcStack_608 = (code *)0x13bef0;
      test_iter_cold_3();
      goto LAB_0013bef0;
    }
  }
  pcStack_608 = test_bcon_new;
  test_iter_cold_2();
  puVar12 = auStack_780;
  pcStack_788 = (code *)0x13bf27;
  pvStack_630 = pvVar5;
  puStack_628 = puVar17;
  puStack_620 = puVar10;
  pvStack_618 = pvVar4;
  uStack_610 = (ulong)uVar2;
  pcStack_608 = (code *)apcStack_388;
  bson_init(auStack_780);
  pcStack_788 = (code *)0x13bf4e;
  bson_append_utf8(auStack_780,"hello",0xffffffff,"world",0xffffffff);
  pcStack_788 = (code *)0x13bf5f;
  uVar8 = bcon_new(0,"hello","world",0);
  pcStack_788 = (code *)0x13bf6a;
  pvVar4 = (void *)bson_get_data(uVar8);
  pcStack_788 = (code *)0x13bf75;
  pvVar5 = (void *)bson_get_data(auStack_780);
  if (uStack_77c == *(uint *)(uVar8 + 4)) {
    pcStack_788 = (code *)0x13bf8e;
    pvVar6 = (void *)bson_get_data(auStack_780);
    pcStack_788 = (code *)0x13bf99;
    pvVar7 = (void *)bson_get_data(uVar8);
    pcStack_788 = (code *)0x13bfa9;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_77c);
    if (iVar1 == 0) {
      pcStack_788 = (code *)0x13bfb5;
      bson_destroy(uVar8);
      pcStack_788 = (code *)0x13bfbd;
      bson_destroy(auStack_780);
      return;
    }
  }
  pcStack_788 = (code *)0x13bfd6;
  uVar9 = bson_as_canonical_extended_json(uVar8,0);
  pcStack_788 = (code *)0x13bfe6;
  uVar11 = bson_as_canonical_extended_json(auStack_780,0);
  uVar2 = *(uint *)(uVar8 + 4);
  uVar3 = uStack_77c;
  if (uVar2 < uStack_77c) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar3 = uStack_77c;
    if (uVar2 <= uStack_77c) {
      uVar3 = uVar2;
    }
    uVar14 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar14) != *(char *)((long)pvVar5 + uVar14)) {
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0013c020;
      }
      uVar14 = uVar14 + 1;
    } while (uVar3 != (uint)uVar14);
  }
  if (uVar2 < uStack_77c) {
    uVar2 = uStack_77c;
  }
  uVar14 = (ulong)(uVar2 - 1);
LAB_0013c020:
  pcStack_788 = (code *)0x13c03e;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uVar9,uVar11);
  pcStack_788 = (code *)0x13c056;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_788 = (code *)0x13c071;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c0b9:
    pcStack_788 = (code *)0x13c0be;
    test_bcon_new_cold_5();
LAB_0013c0be:
    pcStack_788 = (code *)0x13c0c3;
    test_bcon_new_cold_4();
LAB_0013c0c3:
    pcStack_788 = (code *)0x13c0c8;
    test_bcon_new_cold_1();
  }
  else {
    puVar12 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c0be;
    uVar8 = (ulong)*(uint *)(uVar8 + 4);
    pcStack_788 = (code *)0x13c091;
    uVar14 = write(uVar2,pvVar4,uVar8);
    if (uVar14 != uVar8) goto LAB_0013c0c3;
    uVar8 = (ulong)uStack_77c;
    pcStack_788 = (code *)0x13c0a9;
    uVar14 = write(uVar3,pvVar5,uVar8);
    if (uVar14 == uVar8) {
      pcStack_788 = (code *)0x13c0b9;
      test_bcon_new_cold_3();
      goto LAB_0013c0b9;
    }
  }
  pcStack_788 = test_append_ctx;
  test_bcon_new_cold_2();
  pbVar18 = &bStack_a00;
  pcStack_a08 = (code *)0x13c0ed;
  pvStack_7b0 = pvVar5;
  uStack_7a8 = (ulong)uVar2;
  puStack_7a0 = puVar12;
  uStack_798 = uVar8;
  pvStack_790 = pvVar4;
  pcStack_788 = (code *)&pcStack_608;
  bson_init(&bStack_a00);
  pcStack_a08 = (code *)0x13c0fd;
  bson_init(auStack_980);
  pcStack_a08 = (code *)0x13c10d;
  bson_init(auStack_900);
  pcStack_a08 = (code *)0x13c12e;
  bson_append_utf8(auStack_900,"c",0xffffffff,"d",0xffffffff);
  pcStack_a08 = (code *)0x13c155;
  bson_append_utf8(auStack_900,"e",0xffffffff,"f",0xffffffff);
  pcStack_a08 = (code *)0x13c16f;
  bson_append_document(auStack_980,"a",0xffffffff,auStack_900);
  pcVar16 = "e";
  pcStack_a10 = (char *)0x0;
  pcStack_a18 = "}";
  pcStack_a20 = "f";
  pvStack_a28 = (void *)0x13c1a4;
  test_append_ctx_helper(&bStack_a00,"a","{",0,"add magic");
  pcStack_a08 = (code *)0x13c1b3;
  pvVar4 = (void *)bson_get_data(&bStack_a00);
  pcStack_a08 = (code *)0x13c1be;
  pvVar5 = (void *)bson_get_data(auStack_980);
  if (uStack_97c == bStack_a00.len) {
    pcStack_a08 = (code *)0x13c1dc;
    pvVar6 = (void *)bson_get_data(auStack_980);
    pcStack_a08 = (code *)0x13c1e7;
    pvVar7 = (void *)bson_get_data(&bStack_a00);
    pcStack_a08 = (code *)0x13c1f6;
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)uStack_97c);
    if (iVar1 == 0) {
      pcStack_a08 = (code *)0x13c202;
      bson_destroy(&bStack_a00);
      pcStack_a08 = (code *)0x13c20f;
      bson_destroy(auStack_980);
      pcStack_a08 = (code *)0x13c21c;
      bson_destroy(auStack_900);
      return;
    }
  }
  pcStack_a08 = (code *)0x13c238;
  uVar9 = bson_as_canonical_extended_json(&bStack_a00,0);
  pcStack_a08 = (code *)0x13c24d;
  uVar11 = bson_as_canonical_extended_json(auStack_980,0);
  uVar13 = uStack_97c;
  if (bStack_a00.len < uStack_97c) {
    uVar13 = bStack_a00.len;
  }
  if (uVar13 != 0) {
    uVar13 = uStack_97c;
    if (bStack_a00.len <= uStack_97c) {
      uVar13 = bStack_a00.len;
    }
    uVar8 = 0;
    do {
      if (*(char *)((long)pvVar4 + uVar8) != *(char *)((long)pvVar5 + uVar8)) {
        uVar8 = uVar8 & 0xffffffff;
        goto LAB_0013c288;
      }
      uVar8 = uVar8 + 1;
    } while (uVar13 != (uint)uVar8);
  }
  uVar2 = bStack_a00.len;
  if (bStack_a00.len < uStack_97c) {
    uVar2 = uStack_97c;
  }
  uVar8 = (ulong)(uVar2 - 1);
LAB_0013c288:
  pcStack_a08 = (code *)0x13c2a6;
  uVar19 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8);
  pcStack_a08 = (code *)0x13c2be;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar15 = "failure.expected.bson";
  pvVar6 = (void *)0x42;
  pcStack_a08 = (code *)0x13c2d9;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013c325:
    pcStack_a08 = (code *)0x13c32a;
    test_append_ctx_cold_5();
LAB_0013c32a:
    pcStack_a08 = (code *)0x13c32f;
    test_append_ctx_cold_4();
  }
  else {
    pbVar18 = (bson_t *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c32a;
    pcVar15 = (char *)(ulong)uVar2;
    pcStack_a08 = (code *)0x13c2fa;
    pvVar6 = pvVar4;
    uVar8 = write(uVar2,pvVar4,(ulong)bStack_a00.len);
    if (uVar8 == bStack_a00.len) {
      pvVar4 = (void *)(ulong)uStack_97c;
      pcStack_a08 = (code *)0x13c315;
      pvVar6 = pvVar5;
      pcVar15 = (char *)pbVar18;
      pvVar7 = (void *)write(uVar3,pvVar5,(size_t)pvVar4);
      if (pvVar7 != pvVar4) goto LAB_0013c334;
      pvVar6 = (void *)(ulong)uVar3;
      pcStack_a08 = (code *)0x13c325;
      pcVar15 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013c325;
    }
  }
  pcStack_a08 = (code *)0x13c334;
  test_append_ctx_cold_1();
LAB_0013c334:
  pcStack_a08 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_7040 = auStack_7030;
  if (extraout_AL != '\0') {
    uStack_6ff0 = uVar19;
  }
  pvStack_7028 = pvVar6;
  uStack_7018 = uVar9;
  uStack_7010 = uVar11;
  pcStack_7008 = pcVar16;
  pvStack_a28 = pvVar5;
  pcStack_a20 = (char *)pbVar18;
  pcStack_a18 = (char *)pvVar4;
  pcStack_a10 = (char *)(ulong)uVar2;
  pcStack_a08 = (code *)&pcStack_788;
  bcon_append_ctx_init(auStack_6f80);
  puStack_7048 = bStack_a00.padding;
  uStack_7050 = 0x3000000008;
  bcon_append_ctx_va(pcVar15,auStack_6f80,&uStack_7050);
  if ((uint)uStack_7050 < 0x29) {
    uStack_7050 = CONCAT44(uStack_7050._4_4_,(uint)uStack_7050 + 8);
  }
  else {
    puStack_7048 = puStack_7048 + 8;
  }
  bcon_append_ctx(pcVar15,auStack_6f80,"c","d",0);
  bcon_append_ctx_va(pcVar15,auStack_6f80,&uStack_7050);
  return;
}

Assistant:

static void
test_concat (void)
{
   bson_t bcon, expected, child, child2;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);
   bson_init (&child2);

   bson_append_utf8 (&child, "hello", -1, "world", -1);
   bson_append_document (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "{", BCON (&child), "}");

   bson_eq_bson (&bcon, &expected);

   bson_reinit (&bcon);
   bson_reinit (&expected);
   bson_reinit (&child);

   bson_append_utf8 (&child, "0", -1, "bar", -1);
   bson_append_utf8 (&child, "1", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   bson_append_utf8 (&child2, "0", -1, "baz", -1);
   BCON_APPEND (&bcon, "foo", "[", "bar", BCON (&child2), "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&child2);
   bson_destroy (&expected);
}